

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int doattributes(void)

{
  minimal_enlightenment();
  return 0;
}

Assistant:

static int doattributes(void)
{
	minimal_enlightenment();
	return 0;
}